

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          Symbol **args_1,tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *args_2
          )

{
  group_type_pointer pgVar1;
  uint uVar2;
  ushort uVar3;
  underlying_type uVar4;
  Symbol *pSVar5;
  TempVarSymbol *pTVar6;
  RandomizeDetails *pRVar7;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var8;
  SymbolIndex SVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  group_type_pointer pgVar13;
  value_type_pointer ppVar14;
  group_type_pointer pgVar15;
  undefined1 auVar16 [16];
  
  pgVar13 = __return_storage_ptr__->pg;
  uVar11 = (ulong)__return_storage_ptr__->n;
  ppVar14 = __return_storage_ptr__->p;
  lVar12 = 1;
  while( true ) {
    pgVar15 = arrays_->groups_ + pos0;
    pgVar1 = arrays_->groups_ + pos0;
    auVar16[0] = -(pgVar1->m[0].n == '\0');
    auVar16[1] = -(pgVar1->m[1].n == '\0');
    auVar16[2] = -(pgVar1->m[2].n == '\0');
    auVar16[3] = -(pgVar1->m[3].n == '\0');
    auVar16[4] = -(pgVar1->m[4].n == '\0');
    auVar16[5] = -(pgVar1->m[5].n == '\0');
    auVar16[6] = -(pgVar1->m[6].n == '\0');
    auVar16[7] = -(pgVar1->m[7].n == '\0');
    auVar16[8] = -(pgVar1->m[8].n == '\0');
    auVar16[9] = -(pgVar1->m[9].n == '\0');
    auVar16[10] = -(pgVar1->m[10].n == '\0');
    auVar16[0xb] = -(pgVar1->m[0xb].n == '\0');
    auVar16[0xc] = -(pgVar1->m[0xc].n == '\0');
    auVar16[0xd] = -(pgVar1->m[0xd].n == '\0');
    auVar16[0xe] = -(pgVar1->m[0xe].n == '\0');
    auVar16[0xf] = -(pgVar1->m[0xf].n == '\0');
    uVar3 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
    if (uVar3 == 0) {
      pgVar15->m[0xf].n = pgVar15->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar2 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar11 = (ulong)uVar2;
      ppVar14 = arrays_->elements_ + pos0 * 0xf + uVar11;
      ppVar14->first = *args_1;
      SVar9 = (args_2->
              super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
              super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
      uVar10 = *(undefined4 *)
                &(args_2->
                 super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
      uVar4 = (args_2->
              super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
              super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
      pSVar5 = (args_2->
               super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
               super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
      pTVar6 = (args_2->
               super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
               super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
      pRVar7 = (args_2->
               super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
               super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
           (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
      p_Var8 = &(ppVar14->second).
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
      ;
      (p_Var8->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar9;
      *(undefined4 *)
       &(p_Var8->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar10;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar4;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar5;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar6;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar7;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
           (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
           (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Head_base<0UL,_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
      pgVar15->m[uVar11].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar13 = pgVar15;
    }
    if (uVar3 != 0) break;
    pos0 = pos0 + lVar12 & arrays_->groups_size_mask;
    lVar12 = lVar12 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar11;
  __return_storage_ptr__->p = ppVar14;
  __return_storage_ptr__->pg = pgVar13;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }